

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_reset(ZSTD_CCtx *cctx,ZSTD_ResetDirective reset)

{
  size_t sVar1;
  
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    cctx->streamStage = zcss_init;
    cctx->pledgedSrcSizePlusOne = 0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    sVar1 = 0xffffffffffffffc4;
    if (cctx->streamStage == zcss_init) {
      ZSTD_customFree((cctx->localDict).dictBuffer,cctx->customMem);
      ZSTD_freeCDict((cctx->localDict).cdict);
      (cctx->localDict).dictBuffer = (void *)0x0;
      (cctx->localDict).dict = (void *)0x0;
      (cctx->localDict).dictSize = 0;
      *(undefined8 *)&(cctx->localDict).dictContentType = 0;
      (cctx->localDict).cdict = (ZSTD_CDict *)0x0;
      cctx->cdict = (ZSTD_CDict *)0x0;
      (cctx->prefixDict).dict = (void *)0x0;
      (cctx->prefixDict).dictSize = 0;
      *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
      sVar1 = 0;
      memset(&cctx->requestedParams,0,0xb0);
      (cctx->requestedParams).compressionLevel = 3;
      (cctx->requestedParams).fParams.contentSizeFlag = 1;
    }
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Can't reset parameters only when not in init stage.");
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}